

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

int ZSTDMT_serialState_reset
              (serialState_t *serialState,ZSTDMT_seqPool *seqPool,ZSTD_CCtx_params params,
              size_t jobSize,void *dict,size_t dictSize)

{
  U32 UVar1;
  U32 UVar2;
  U32 UVar3;
  BYTE *pBVar4;
  bool bVar5;
  U32 UVar6;
  ZSTD_allocFunction p_Var7;
  ZSTD_freeFunction p_Var8;
  void *pvVar9;
  U32 UVar10;
  uint uVar11;
  U64 UVar12;
  size_t __size;
  size_t __size_00;
  ldmEntry_t *plVar13;
  BYTE *pBVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  
  if (params.ldmParams.enableLdm == 0) {
    params.ldmParams.enableLdm = 0;
    params.ldmParams.hashLog = 0;
    params.ldmParams.bucketSizeLog = 0;
    params.ldmParams.minMatchLength = 0;
    params.ldmParams.hashRateLog = 0;
    params.ldmParams.windowLog = 0;
  }
  else {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4c36,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t)"
                   );
    }
    if (0x1f < params.ldmParams.hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4c37,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t)"
                   );
    }
    if (params.ldmParams.minMatchLength - 1 == 0) {
      UVar12 = 1;
    }
    else {
      lVar16 = -0x30e44323485a9b9d;
      UVar12 = 1;
      uVar15 = (ulong)(params.ldmParams.minMatchLength - 1);
      do {
        lVar17 = lVar16;
        if ((uVar15 & 1) == 0) {
          lVar17 = 1;
        }
        UVar12 = UVar12 * lVar17;
        lVar16 = lVar16 * lVar16;
        bVar5 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar5);
    }
    (serialState->ldmState).hashPower = UVar12;
  }
  pvVar9 = params.customMem.opaque;
  p_Var8 = params.customMem.customFree;
  p_Var7 = params.customMem.customAlloc;
  UVar10 = params.ldmParams.hashLog;
  UVar3 = params.ldmParams.enableLdm;
  serialState->nextJobID = 0;
  if (params.fParams.checksumFlag != 0) {
    (serialState->xxhState).total_len = 0;
    (serialState->xxhState).v1 = 0x60ea27eeadc0b5d6;
    (serialState->xxhState).v2 = 0xc2b2ae3d27d4eb4f;
    (serialState->xxhState).v3 = 0;
    (serialState->xxhState).v4 = 0x61c8864e7a143579;
    (serialState->xxhState).mem64[0] = 0;
    (serialState->xxhState).mem64[1] = 0;
    (serialState->xxhState).mem64[2] = 0;
    (serialState->xxhState).mem64[3] = 0;
    (serialState->xxhState).memsize = 0;
    (serialState->xxhState).reserved[0] = 0;
  }
  if (params.ldmParams.enableLdm == 0) goto LAB_00160334;
  __size = 8L << ((byte)params.ldmParams.hashLog & 0x3f);
  uVar18 = params.ldmParams.hashLog - params.ldmParams.bucketSizeLog;
  __size_00 = 1L << ((byte)uVar18 & 0x3f);
  UVar1 = (serialState->params).ldmParams.hashLog;
  UVar2 = (serialState->params).ldmParams.bucketSizeLog;
  uVar15 = (ulong)params.ldmParams.minMatchLength;
  pthread_mutex_lock((pthread_mutex_t *)seqPool);
  seqPool->bufferSize = (jobSize / uVar15) * 0xc;
  pthread_mutex_unlock((pthread_mutex_t *)seqPool);
  (serialState->ldmState).window.nextSrc = (BYTE *)0x0;
  (serialState->ldmState).window.base = (BYTE *)0x0;
  (serialState->ldmState).window.dictBase = (BYTE *)0x0;
  (serialState->ldmState).window.dictLimit = 0;
  (serialState->ldmState).window.lowLimit = 0;
  (serialState->ldmState).window.base = "";
  (serialState->ldmState).window.dictBase = "";
  (serialState->ldmState).window.dictLimit = 1;
  (serialState->ldmState).window.lowLimit = 1;
  (serialState->ldmState).window.nextSrc =
       (BYTE *)"num chunks = %li (bit plane) and %li (exponent) \n";
  (serialState->ldmWindow).nextSrc = (serialState->ldmState).window.nextSrc;
  (serialState->ldmWindow).base = (serialState->ldmState).window.base;
  (serialState->ldmWindow).dictBase = (serialState->ldmState).window.dictBase;
  UVar6 = (serialState->ldmState).window.lowLimit;
  (serialState->ldmWindow).dictLimit = (serialState->ldmState).window.dictLimit;
  (serialState->ldmWindow).lowLimit = UVar6;
  plVar13 = (serialState->ldmState).hashTable;
  if (plVar13 == (ldmEntry_t *)0x0) {
LAB_00160247:
    if (p_Var7 == (ZSTD_allocFunction)0x0) {
      plVar13 = (ldmEntry_t *)malloc(__size);
    }
    else {
      plVar13 = (ldmEntry_t *)(*p_Var7)(pvVar9,__size);
    }
    (serialState->ldmState).hashTable = plVar13;
  }
  else if ((serialState->params).ldmParams.hashLog < UVar10) {
    if (plVar13 != (ldmEntry_t *)0x0) {
      if (p_Var8 == (ZSTD_freeFunction)0x0) {
        free(plVar13);
      }
      else {
        (*p_Var8)(pvVar9,plVar13);
      }
    }
    goto LAB_00160247;
  }
  pBVar14 = (serialState->ldmState).bucketOffsets;
  if ((pBVar14 == (BYTE *)0x0) || (UVar1 - UVar2 < uVar18)) {
    if (pBVar14 != (BYTE *)0x0) {
      if (p_Var8 == (ZSTD_freeFunction)0x0) {
        free(pBVar14);
      }
      else {
        (*p_Var8)(pvVar9,pBVar14);
      }
    }
    if (p_Var7 == (ZSTD_allocFunction)0x0) {
      pBVar14 = (BYTE *)malloc(__size_00);
    }
    else {
      pBVar14 = (BYTE *)(*p_Var7)(pvVar9,__size_00);
    }
    (serialState->ldmState).bucketOffsets = pBVar14;
  }
  plVar13 = (serialState->ldmState).hashTable;
  if (plVar13 == (ldmEntry_t *)0x0) {
    return 1;
  }
  if ((serialState->ldmState).bucketOffsets == (BYTE *)0x0) {
    return 1;
  }
  memset(plVar13,0,__size);
  memset((serialState->ldmState).bucketOffsets,0,__size_00);
LAB_00160334:
  if (dict != (void *)0x0 && UVar3 != 0) {
    if (dictSize != 0) {
      pBVar14 = (serialState->ldmState).window.base;
      if (pBVar14 == (BYTE *)0x0) {
        __assert_fail("window->base != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2226,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
      }
      if ((serialState->ldmState).window.dictBase == (BYTE *)0x0) {
        __assert_fail("window->dictBase != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2227,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
      }
      pBVar4 = (serialState->ldmState).window.nextSrc;
      if (pBVar4 != (BYTE *)dict) {
        uVar15 = (long)pBVar4 - (long)pBVar14;
        UVar3 = (serialState->ldmState).window.dictLimit;
        (serialState->ldmState).window.lowLimit = UVar3;
        if (uVar15 >> 0x20 != 0) {
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x222e,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
        }
        UVar10 = (U32)uVar15;
        (serialState->ldmState).window.dictLimit = UVar10;
        (serialState->ldmState).window.dictBase = pBVar14;
        (serialState->ldmState).window.base = (BYTE *)((long)dict - uVar15);
        if (UVar10 - UVar3 < 8) {
          (serialState->ldmState).window.lowLimit = UVar10;
        }
      }
      pBVar14 = (BYTE *)((long)dict + dictSize);
      (serialState->ldmState).window.nextSrc = pBVar14;
      pBVar4 = (serialState->ldmState).window.dictBase;
      uVar18 = (serialState->ldmState).window.dictLimit;
      if (dict < pBVar4 + uVar18 && pBVar4 + (serialState->ldmState).window.lowLimit < pBVar14) {
        uVar11 = (uint)((long)pBVar14 - (long)pBVar4);
        if ((long)(ulong)uVar18 < (long)pBVar14 - (long)pBVar4) {
          uVar11 = uVar18;
        }
        (serialState->ldmState).window.lowLimit = uVar11;
      }
    }
    ZSTD_ldm_fillHashTable
              (&serialState->ldmState,(BYTE *)dict,(BYTE *)(dictSize + (long)dict),&params.ldmParams
              );
  }
  memcpy(&serialState->params,&params,0x90);
  (serialState->params).jobSize = jobSize & 0xffffffff;
  return 0;
}

Assistant:

static int ZSTDMT_serialState_reset(serialState_t* serialState,
                        ZSTDMT_seqPool* seqPool, ZSTD_CCtx_params params,
                        size_t jobSize, const void* dict, size_t const dictSize)
{
    /* Adjust parameters */
    if (params.ldmParams.enableLdm) {
        DEBUGLOG(4, "LDM window size = %u KB", (1U << params.cParams.windowLog) >> 10);
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        serialState->ldmState.hashPower =
                ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    } else {
        memset(&params.ldmParams, 0, sizeof(params.ldmParams));
    }
    serialState->nextJobID = 0;
    if (params.fParams.checksumFlag)
        XXH64_reset(&serialState->xxhState, 0);
    if (params.ldmParams.enableLdm) {
        ZSTD_customMem cMem = params.customMem;
        unsigned const hashLog = params.ldmParams.hashLog;
        size_t const hashSize = ((size_t)1 << hashLog) * sizeof(ldmEntry_t);
        unsigned const bucketLog =
            params.ldmParams.hashLog - params.ldmParams.bucketSizeLog;
        size_t const bucketSize = (size_t)1 << bucketLog;
        unsigned const prevBucketLog =
            serialState->params.ldmParams.hashLog -
            serialState->params.ldmParams.bucketSizeLog;
        /* Size the seq pool tables */
        ZSTDMT_setNbSeq(seqPool, ZSTD_ldm_getMaxNbSeq(params.ldmParams, jobSize));
        /* Reset the window */
        ZSTD_window_init(&serialState->ldmState.window);
        serialState->ldmWindow = serialState->ldmState.window;
        /* Resize tables and output space if necessary. */
        if (serialState->ldmState.hashTable == NULL || serialState->params.ldmParams.hashLog < hashLog) {
            ZSTD_free(serialState->ldmState.hashTable, cMem);
            serialState->ldmState.hashTable = (ldmEntry_t*)ZSTD_malloc(hashSize, cMem);
        }
        if (serialState->ldmState.bucketOffsets == NULL || prevBucketLog < bucketLog) {
            ZSTD_free(serialState->ldmState.bucketOffsets, cMem);
            serialState->ldmState.bucketOffsets = (BYTE*)ZSTD_malloc(bucketSize, cMem);
        }
        if (!serialState->ldmState.hashTable || !serialState->ldmState.bucketOffsets)
            return 1;
        /* Zero the tables */
        memset(serialState->ldmState.hashTable, 0, hashSize);
        memset(serialState->ldmState.bucketOffsets, 0, bucketSize);
    }

    /* Update window state and fill hash table with dict */
    if (params.ldmParams.enableLdm && dict) {
        ZSTD_window_update(&serialState->ldmState.window, dict, dictSize);
        ZSTD_ldm_fillHashTable(&serialState->ldmState, (const BYTE*)dict, (const BYTE*)dict + dictSize, &params.ldmParams);
    }

    serialState->params = params;
    serialState->params.jobSize = (U32)jobSize;
    return 0;
}